

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<void_*>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<void*>,void*>(kj *this,void **params)

{
  ImmediatePromiseNode<void_*> *this_00;
  void **value;
  ImmediatePromiseNode<void_*> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<void_*>_> OVar1;
  ExceptionOr<void_*> local_188;
  NoInfer<void_*> *local_18;
  void **params_local;
  
  local_18 = params;
  params_local = (void **)this;
  this_00 = (ImmediatePromiseNode<void_*> *)operator_new(0x178);
  value = fwd<void*>(local_18);
  _::ExceptionOr<void_*>::ExceptionOr(&local_188,value);
  _::ImmediatePromiseNode<void_*>::ImmediatePromiseNode(this_00,&local_188);
  Own<kj::_::ImmediatePromiseNode<void_*>_>::Own
            ((Own<kj::_::ImmediatePromiseNode<void_*>_> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ImmediatePromiseNode<void*>>::instance);
  _::ExceptionOr<void_*>::~ExceptionOr(&local_188);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}